

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix2f __thiscall Matrix3f::getSubmatrix2x2(Matrix3f *this,int i0,int j0)

{
  float fVar1;
  float *pfVar2;
  int in_ECX;
  int in_EDX;
  Matrix3f *in_RSI;
  Matrix2f *in_RDI;
  undefined1 auVar3 [64];
  undefined8 in_XMM1_Qa;
  Matrix2f MVar4;
  int j;
  int i;
  Matrix2f *out;
  undefined4 local_20;
  undefined4 local_1c;
  
  auVar3 = ZEXT1664((undefined1  [16])0x0);
  Matrix2f::Matrix2f(in_RDI,0.0);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      pfVar2 = operator()(in_RSI,local_1c + in_EDX,local_20 + in_ECX);
      fVar1 = *pfVar2;
      pfVar2 = Matrix2f::operator()(in_RDI,local_1c,local_20);
      auVar3 = ZEXT464((uint)fVar1);
      *pfVar2 = fVar1;
    }
  }
  MVar4.m_elements._0_8_ = auVar3._0_8_;
  MVar4.m_elements[2] = (float)(int)in_XMM1_Qa;
  MVar4.m_elements[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Matrix2f)MVar4.m_elements;
}

Assistant:

Matrix2f Matrix3f::getSubmatrix2x2( int i0, int j0 ) const
{
	Matrix2f out;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			out( i, j ) = ( *this )( i + i0, j + j0 );
		}
	}

	return out;
}